

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

void skip(stbi *s,int n)

{
  int n_local;
  stbi *s_local;
  
  if (s->img_file == (FILE *)0x0) {
    s->img_buffer = s->img_buffer + n;
  }
  else {
    fseek((FILE *)s->img_file,(long)n,1);
  }
  return;
}

Assistant:

static void skip(stbi *s, int n)
{
#ifndef STBI_NO_STDIO
   if (s->img_file)
      fseek(s->img_file, n, SEEK_CUR);
   else
#endif
      s->img_buffer += n;
}